

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  int q;
  ulong uVar4;
  int q_1;
  int iVar5;
  ulong uVar6;
  uint _c;
  uint uVar7;
  ulong uVar8;
  uint _w;
  float fVar9;
  float fVar10;
  float local_d4;
  Mat square_sum_blob;
  Mat local_70;
  
  _w = bottom_top_blob->c;
  uVar7 = bottom_top_blob->h * bottom_top_blob->w;
  iVar5 = this->across_spatial;
  iVar1 = this->across_channel;
  if (iVar1 == 0 || iVar5 == 0) {
    if (iVar5 != 0 && iVar1 == 0) {
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      if ((int)_w < 1) {
        _w = 0;
      }
      _c = 0;
      do {
        if (_c == _w) {
          return 0;
        }
        Mat::channel(&square_sum_blob,bottom_top_blob,_c);
        pvVar2 = square_sum_blob.data;
        Mat::~Mat(&square_sum_blob);
        fVar9 = 0.0;
        for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
          fVar10 = *(float *)((long)pvVar2 + uVar3 * 4);
          fVar9 = fVar9 + fVar10 * fVar10;
        }
        if (this->eps_mode == 0) {
          fVar9 = fVar9 + this->eps;
LAB_001552a8:
          fVar10 = SQRT(fVar9);
        }
        else {
          if (this->eps_mode != 1) {
            if (fVar9 <= this->eps) {
              fVar9 = this->eps;
            }
            goto LAB_001552a8;
          }
          fVar10 = SQRT(fVar9);
          if (SQRT(fVar9) <= this->eps) {
            fVar10 = this->eps;
          }
        }
        uVar3 = 0;
        if (this->channel_shared == 0) {
          uVar3 = (ulong)_c;
        }
        fVar9 = *(float *)((long)(this->scale_data).data + uVar3 * 4);
        for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
          *(float *)((long)pvVar2 + uVar3 * 4) =
               *(float *)((long)pvVar2 + uVar3 * 4) * fVar9 * (1.0 / fVar10);
        }
        _c = _c + 1;
      } while( true );
    }
    if (iVar1 == 0 || iVar5 != 0) {
      return 0;
    }
    square_sum_blob.elemsize._0_4_ = 0;
    square_sum_blob._20_8_ = 0;
    square_sum_blob.data = (void *)0x0;
    square_sum_blob.refcount._0_4_ = 0;
    square_sum_blob.refcount._4_4_ = 0;
    square_sum_blob.allocator = (Allocator *)0x0;
    square_sum_blob.dims = 0;
    square_sum_blob.w = 0;
    square_sum_blob.h = 0;
    square_sum_blob.c = 0;
    square_sum_blob.cstep = 0;
    Mat::create(&square_sum_blob,uVar7,bottom_top_blob->elemsize,opt->workspace_allocator);
    iVar5 = -100;
    if ((square_sum_blob.data == (void *)0x0) ||
       ((long)square_sum_blob.c * square_sum_blob.cstep == 0)) goto LAB_001557da;
    if (this->channel_shared == 0) {
      uVar6 = 0;
      uVar3 = (ulong)_w;
      if ((int)_w < 1) {
        uVar3 = uVar6;
      }
      uVar8 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar8 = uVar6;
      }
      for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        local_d4 = 0.0;
        for (iVar5 = 0; (int)uVar3 != iVar5; iVar5 = iVar5 + 1) {
          Mat::channel(&local_70,bottom_top_blob,iVar5);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          fVar9 = *(float *)((long)pvVar2 + uVar6 * 4);
          local_d4 = local_d4 + fVar9 * fVar9;
        }
        if (this->eps_mode == 0) {
          local_d4 = local_d4 + this->eps;
LAB_0015574a:
          fVar9 = SQRT(local_d4);
        }
        else {
          if (this->eps_mode != 1) {
            if (local_d4 <= this->eps) {
              local_d4 = this->eps;
            }
            goto LAB_0015574a;
          }
          fVar9 = SQRT(local_d4);
          if (SQRT(local_d4) <= this->eps) {
            fVar9 = this->eps;
          }
        }
        *(float *)((long)square_sum_blob.data + uVar6 * 4) = 1.0 / fVar9;
      }
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        Mat::channel(&local_70,bottom_top_blob,(int)uVar6);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        fVar9 = *(float *)((long)(this->scale_data).data + uVar6 * 4);
        for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
          *(float *)((long)pvVar2 + uVar4 * 4) =
               *(float *)((long)pvVar2 + uVar4 * 4) * fVar9 *
               *(float *)((long)square_sum_blob.data + uVar4 * 4);
        }
      }
    }
    else {
      fVar9 = *(this->scale_data).data;
      uVar3 = 0;
      if ((int)_w < 1) {
        _w = 0;
      }
      uVar6 = (ulong)uVar7;
      if ((int)uVar7 < 1) {
        uVar6 = uVar3;
      }
      for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
        local_d4 = 0.0;
        for (uVar7 = 0; _w != uVar7; uVar7 = uVar7 + 1) {
          Mat::channel(&local_70,bottom_top_blob,uVar7);
          pvVar2 = local_70.data;
          Mat::~Mat(&local_70);
          fVar10 = *(float *)((long)pvVar2 + uVar3 * 4);
          local_d4 = local_d4 + fVar10 * fVar10;
        }
        if (this->eps_mode == 0) {
          local_d4 = local_d4 + this->eps;
LAB_001554e7:
          fVar10 = SQRT(local_d4);
        }
        else {
          if (this->eps_mode != 1) {
            if (local_d4 <= this->eps) {
              local_d4 = this->eps;
            }
            goto LAB_001554e7;
          }
          fVar10 = SQRT(local_d4);
          if (SQRT(local_d4) <= this->eps) {
            fVar10 = this->eps;
          }
        }
        *(float *)((long)square_sum_blob.data + uVar3 * 4) = fVar9 / fVar10;
      }
      for (uVar7 = 0; uVar7 != _w; uVar7 = uVar7 + 1) {
        Mat::channel(&local_70,bottom_top_blob,uVar7);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          *(float *)((long)pvVar2 + uVar3 * 4) =
               *(float *)((long)square_sum_blob.data + uVar3 * 4) *
               *(float *)((long)pvVar2 + uVar3 * 4);
        }
      }
    }
  }
  else {
    square_sum_blob.elemsize._0_4_ = 0;
    square_sum_blob._20_8_ = 0;
    square_sum_blob.data = (void *)0x0;
    square_sum_blob.refcount._0_4_ = 0;
    square_sum_blob.refcount._4_4_ = 0;
    square_sum_blob.allocator = (Allocator *)0x0;
    square_sum_blob.dims = 0;
    square_sum_blob.w = 0;
    square_sum_blob.h = 0;
    square_sum_blob.c = 0;
    square_sum_blob.cstep = 0;
    Mat::create(&square_sum_blob,_w,bottom_top_blob->elemsize,opt->workspace_allocator);
    iVar5 = -100;
    if ((square_sum_blob.data == (void *)0x0) ||
       ((long)square_sum_blob.c * square_sum_blob.cstep == 0)) goto LAB_001557da;
    uVar6 = 0;
    uVar3 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar3 = uVar6;
    }
    uVar8 = (ulong)_w;
    if ((int)_w < 1) {
      uVar8 = uVar6;
    }
    for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
      Mat::channel(&local_70,bottom_top_blob,(int)uVar6);
      pvVar2 = local_70.data;
      Mat::~Mat(&local_70);
      fVar9 = 0.0;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        fVar10 = *(float *)((long)pvVar2 + uVar4 * 4);
        fVar9 = fVar9 + fVar10 * fVar10;
      }
      *(float *)((long)square_sum_blob.data + uVar6 * 4) = fVar9;
    }
    fVar9 = 0.0;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      fVar9 = fVar9 + *(float *)((long)square_sum_blob.data + uVar6 * 4);
    }
    if (this->eps_mode == 0) {
      fVar9 = fVar9 + this->eps;
LAB_00155558:
      fVar10 = SQRT(fVar9);
    }
    else {
      if (this->eps_mode != 1) {
        if (fVar9 <= this->eps) {
          fVar9 = this->eps;
        }
        goto LAB_00155558;
      }
      fVar10 = SQRT(fVar9);
      if (SQRT(fVar9) <= this->eps) {
        fVar10 = this->eps;
      }
    }
    if (this->channel_shared == 0) {
      for (uVar6 = 0; uVar6 != uVar8; uVar6 = uVar6 + 1) {
        Mat::channel(&local_70,bottom_top_blob,(int)uVar6);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        fVar9 = *(float *)((long)(this->scale_data).data + uVar6 * 4);
        for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
          *(float *)((long)pvVar2 + uVar4 * 4) =
               *(float *)((long)pvVar2 + uVar4 * 4) * fVar9 * (1.0 / fVar10);
        }
      }
    }
    else {
      fVar9 = *(this->scale_data).data;
      for (iVar5 = 0; iVar5 != (int)uVar8; iVar5 = iVar5 + 1) {
        Mat::channel(&local_70,bottom_top_blob,iVar5);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar2 + uVar6 * 4) =
               *(float *)((long)pvVar2 + uVar6 * 4) * (1.0 / fVar10) * fVar9;
        }
      }
    }
  }
  iVar5 = 0;
LAB_001557da:
  Mat::~Mat(&square_sum_blob);
  return iVar5;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = 1.f / sqrt(ssum + eps);
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max((float)sqrt(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = 1.f / sqrt(std::max(ssum, eps));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = 1.f / sqrt(ssum + eps);
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max((float)sqrt(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = 1.f / sqrt(std::max(ssum, eps));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrt(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrt(std::max(ssum, eps));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrt(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrt(std::max(ssum, eps));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}